

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_factory.cpp
# Opt level: O2

unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_> __thiscall
n_e_s::core::MmuFactory::create(MmuFactory *this,MemBankList *mem_banks)

{
  pointer puVar1;
  __uniq_ptr_impl<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> this_00;
  pointer *__ptr;
  pointer puVar2;
  _Head_base<0UL,_n_e_s::core::IMemBank_*,_false> local_38;
  __uniq_ptr_impl<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> local_30;
  
  std::make_unique<n_e_s::core::Mmu>();
  this_00._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
  super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl =
       local_30._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
       super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl;
  local_30._M_t.super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
  super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl =
       (tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)
       (_Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>)0x0;
  *(tuple<n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_> *)this =
       this_00._M_t.
       super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>.
       super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl;
  std::unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_>::~unique_ptr
            ((unique_ptr<n_e_s::core::Mmu,_std::default_delete<n_e_s::core::Mmu>_> *)&local_30);
  puVar1 = (mem_banks->
           super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (mem_banks->
                super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_38._M_head_impl =
         (puVar2->_M_t).
         super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>.
         _M_t.
         super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
         .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    (puVar2->_M_t).
    super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>._M_t.
    super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>.
    super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl = (IMemBank *)0x0;
    Mmu::add_mem_bank((Mmu *)this_00._M_t.
                             super__Tuple_impl<0UL,_n_e_s::core::Mmu_*,_std::default_delete<n_e_s::core::Mmu>_>
                             .super__Head_base<0UL,_n_e_s::core::Mmu_*,_false>._M_head_impl,
                      (unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
                       *)&local_38);
    if (local_38._M_head_impl != (IMemBank *)0x0) {
      (*(local_38._M_head_impl)->_vptr_IMemBank[1])();
    }
  }
  return (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         (__uniq_ptr_data<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<IMmu> MmuFactory::create(MemBankList mem_banks) {
    std::unique_ptr<IMmu> immu = std::make_unique<Mmu>();
    auto mmu = static_cast<Mmu *>(immu.get());

    for (std::unique_ptr<IMemBank> &mem_bank : mem_banks) {
        mmu->add_mem_bank(std::move(mem_bank));
    }

    return immu;
}